

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_t *__k;
  iterator iVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  bool bVar7;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  set<char_*,_std::less<char_*>,_std::allocator<char_*>_> p_set;
  char *p;
  
  iVar4 = 0x400;
  printf("Test malloc(0) x %d\n",0x400);
  p_set._M_t._M_impl._0_4_ = 0;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = &p_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&p_set;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&p_set;
  do {
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar7) {
      std::
      _Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>::
      ~_Rb_tree((_Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
                 *)local_68);
      puts("Test small malloc");
      local_68 = (undefined1  [8])malloc(0x400000);
      (*noopt_helper)((_Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
                       *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        puts("Test malloc(0 - N)");
        for (sVar3 = 0xffffffffffffffff; sVar3 != 0xffffffffffffc000; sVar3 = sVar3 - 1) {
          TryAllocExpectFail(sVar3);
        }
        puts("Test malloc(0 - 1048576 - N)");
        for (sVar3 = 0xfffffffffff00000; sVar3 != 0xffffffffffefc000; sVar3 = sVar3 - 1) {
          TryAllocExpectFail(sVar3);
        }
        puts("Test malloc(max/2 +- N)");
        uVar6 = 0;
        for (lVar5 = 0; lVar5 != -0x40; lVar5 = lVar5 + -1) {
          TryAllocMightFail(lVar5 + 0x8000000000000000);
          TryAllocMightFail(uVar6 | 0x8000000000000000);
          uVar6 = uVar6 + 1;
        }
        puts("PASS");
        return 0;
      }
      pcVar2 = "Check failed: p_small != nullptr\n";
      uStack_70 = 0x21;
LAB_00102574:
      syscall(1,2,pcVar2,uStack_70);
      abort();
    }
    p_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(1);
    iVar1 = std::
            _Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
            ::find((_Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
                    *)local_68,(key_type *)__k);
    if (iVar1._M_node != (_Base_ptr)&p_set) {
      pcVar2 = "Check failed: p_set.find(p) == p_set.end()\n";
      uStack_70 = 0x2b;
      goto LAB_00102574;
    }
    std::_Rb_tree<char*,char*,std::_Identity<char*>,std::less<char*>,std::allocator<char*>>::
    _M_insert_unique_<char*const&>
              ((_Rb_tree<char*,char*,std::_Identity<char*>,std::less<char*>,std::allocator<char*>> *
               )local_68,(_Base_ptr)&p_set,(char **)__k);
  } while( true );
}

Assistant:

int main (int argc, char** argv) {
  // Allocate some 0-byte objects.  They better be unique.
  // 0 bytes is not large but it exercises some paths related to
  // large-allocation code.
  {
    static const int kZeroTimes = 1024;
    printf("Test malloc(0) x %d\n", kZeroTimes);
    set<char*> p_set;
    for ( int i = 0; i < kZeroTimes; ++i ) {
      char* p = new char;
      CHECK(p != nullptr);
      CHECK(p_set.find(p) == p_set.end());
      p_set.insert(p_set.end(), p);
    }
    // Just leak the memory.
  }

  // Grab some memory so that some later allocations are guaranteed to fail.
  printf("Test small malloc\n");
  void* p_small = noopt(malloc(4*1048576));
  CHECK(p_small != nullptr);

  // Test sizes up near the maximum size_t.
  // These allocations test the wrap-around code.
  printf("Test malloc(0 - N)\n");
  const size_t zero = 0;
  static const size_t kMinusNTimes = 16384;
  for ( size_t i = 1; i < kMinusNTimes; ++i ) {
    TryAllocExpectFail(zero - i);
  }

  // Test sizes a bit smaller.
  // The small malloc above guarantees that all these return nullptr.
  printf("Test malloc(0 - 1048576 - N)\n");
  static const size_t kMinusMBMinusNTimes = 16384;
  for ( size_t i = 0; i < kMinusMBMinusNTimes; ++i) {
    TryAllocExpectFail(zero - 1048576 - i);
  }

  // Test sizes at half of size_t.
  // These might or might not fail to allocate.
  printf("Test malloc(max/2 +- N)\n");
  static const size_t kHalfPlusMinusTimes = 64;
  const size_t half = (zero - 2) / 2 + 1;
  for ( size_t i = 0; i < kHalfPlusMinusTimes; ++i) {
    TryAllocMightFail(half - i);
    TryAllocMightFail(half + i);
  }

  printf("PASS\n");
  return 0;
}